

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void movntq_(PDISASM pMyDisasm)

{
  int iVar1;
  uint uVar2;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    if ((pMyDisasm->Reserved_).VEX.pp == '\x01') {
      if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
        if ((pMyDisasm->Reserved_).EVEX.W == '\x01') goto LAB_00121e50;
        (pMyDisasm->Instruction).Category = 0x140000;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vmovntdq",9);
        (pMyDisasm->Reserved_).EVEX.tupletype = '\x03';
      }
      else {
        (pMyDisasm->Instruction).Category = 0x110000;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vmovntdq",9);
      }
      vex_ExGx(pMyDisasm);
      return;
    }
  }
  else {
    iVar1 = Security(2,pMyDisasm);
    if (iVar1 == 0) {
      return;
    }
    uVar2 = (uint)(*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6);
    (pMyDisasm->Reserved_).MOD_ = uVar2;
    if (uVar2 != 3) {
      if ((pMyDisasm->Prefix).OperandSize == '\x01') {
        (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
        (pMyDisasm->Prefix).OperandSize = '\b';
        (pMyDisasm->Reserved_).MemDecoration = 9;
        (pMyDisasm->Instruction).Category = 0x50019;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"movntdq",8);
        (pMyDisasm->Reserved_).Register_ = 4;
      }
      else {
        (pMyDisasm->Reserved_).MemDecoration = 4;
        (pMyDisasm->Instruction).Category = 0x40019;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"movntq",7);
        (pMyDisasm->Reserved_).Register_ = 2;
      }
      ExGx(pMyDisasm);
      return;
    }
  }
LAB_00121e50:
  failDecode(pMyDisasm);
  return;
}

Assistant:

void __bea_callspec__ movntq_(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      if ((GV.EVEX.state == InUsePrefix) && (GV.EVEX.W == 1)) {
        failDecode(pMyDisasm);
        return;
      }
      pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
      if (GV.EVEX.state == InUsePrefix) {
        GV.EVEX.tupletype = FULL_MEM;
      }
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vmovntdq");
      #endif
      if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL_MEM;
      vex_ExGx(pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    if (!Security(2, pMyDisasm)) return;
    GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
    if (GV.MOD_== 0x3) {
      failDecode(pMyDisasm);
    }
     /* ========== 0x66 */
    else if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
      GV.OperandSize = GV.OriginalOperandSize;
      pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
      GV.MemDecoration = Arg1_m128_xmm;
      pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+CACHEABILITY_CONTROL;
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movntdq");
      #endif
      GV.Register_ = SSE_REG;
      ExGx(pMyDisasm);

    }
    else {
      GV.MemDecoration = Arg1qword;
      pMyDisasm->Instruction.Category = SSE_INSTRUCTION+CACHEABILITY_CONTROL;
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movntq");
      #endif
      GV.Register_ = MMX_REG;
      ExGx(pMyDisasm);
    }
  }
}